

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::setNumThreads
          (DefaultThreadPoolProvider *this,int count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer ptVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  pointer *__ptr;
  element_type *peVar6;
  mutex *__mutex;
  ulong __new_size;
  long *local_48;
  pthread_mutex_t *local_40;
  thread local_38;
  
  __mutex = &((this->_data).
              super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_threadMutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(local_40);
    _Unwind_Resume(uVar4);
  }
  peVar6 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = (long)(peVar6->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar6->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  __new_size = (ulong)count;
  local_40 = (pthread_mutex_t *)__mutex;
  if (__new_size < uVar5) {
    lockedFinish(this);
    peVar6 = (this->_data).
             super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar5 = 0;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::resize(&peVar6->_threads,__new_size);
  if (uVar5 < __new_size) {
    do {
      peVar6 = (this->_data).
               super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var1 = (this->_data).
               super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      local_38._M_id._M_thread = (id)0;
      local_48 = (long *)operator_new(0x30);
      *local_48 = (long)&PTR___State_impl_00108c80;
      local_48[1] = (long)peVar6;
      local_48[2] = (long)p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      local_48[3] = (long)this;
      local_48[4] = (long)threadLoop;
      local_48[5] = 0;
      std::thread::_M_start_thread(&local_38,&local_48,0);
      if (local_48 != (long *)0x0) {
        (**(code **)(*local_48 + 8))();
      }
      ptVar2 = (((this->_data).
                 super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((native_handle_type)ptVar2[uVar5]._M_id != 0) {
        std::terminate();
      }
      ptVar2[uVar5]._M_id = local_38._M_id._M_thread;
      uVar5 = uVar5 + 1;
    } while (__new_size != uVar5);
  }
  peVar6 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  LOCK();
  (peVar6->_threadCount).super___atomic_base<int>._M_i =
       (__int_type)
       ((ulong)((long)(peVar6->_threads).
                      super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(peVar6->_threads).
                     super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  UNLOCK();
  pthread_mutex_unlock(local_40);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::setNumThreads (int count)
{
    // since we're a private class, the thread pool won't call us if
    // we aren't changing size so no need to check that...

    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    size_t curThreads = _data->_threads.size ();
    size_t nToAdd     = static_cast<size_t> (count);

    if (nToAdd < curThreads)
    {
        // no easy way to only shutdown the n threads at the end of
        // the vector (well, really, guaranteeing they are the ones to
        // be woken up), so just kill all of the threads
        lockedFinish ();
        curThreads = 0;
    }

    _data->_threads.resize (nToAdd);
    for (size_t i = curThreads; i < nToAdd; ++i)
    {
        _data->_threads[i] =
            std::thread (&DefaultThreadPoolProvider::threadLoop, this, _data);
    }
    _data->_threadCount = static_cast<int> (_data->_threads.size ());
}